

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_server.cpp
# Opt level: O0

void __thiscall EchoServer::echo_message_cb(EchoServer *this,TcpConnSP *conn,InputBuffer *ibuf)

{
  int iVar1;
  char *pcVar2;
  element_type *peVar3;
  size_type sVar4;
  int *__n;
  uint in_R8D;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string msg_str;
  char *msg;
  InputBuffer *ibuf_local;
  TcpConnSP *conn_local;
  EchoServer *this_local;
  
  pcVar2 = InputBuffer::get_from_buf(ibuf);
  msg_str.field_2._8_8_ = pcVar2;
  iVar1 = BufferBase::length(&ibuf->super_BufferBase);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>((string *)local_48,pcVar2,pcVar2 + iVar1,&local_49)
  ;
  std::allocator<char>::~allocator(&local_49);
  iVar1 = BufferBase::length(&ibuf->super_BufferBase);
  BufferBase::pop(&ibuf->super_BufferBase,iVar1);
  InputBuffer::adjust(ibuf);
  __n = &pr_level;
  if (1 < pr_level) {
    peVar3 = std::__shared_ptr_access<TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)conn);
    in_R8D = TcpConnection::get_fd(peVar3);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_48);
    __n = (int *)0x23;
    printf("[%-5s][%s:%d] socket fd %d recv message:%s","info","echo_message_cb",0x23,(ulong)in_R8D,
           pcVar2);
  }
  peVar3 = std::__shared_ptr_access<TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)conn);
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48)
  ;
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  TcpConnection::send(peVar3,(int)pcVar2,(void *)(sVar4 & 0xffffffff),(size_t)__n,in_R8D);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void echo_message_cb(const TcpConnSP& conn, InputBuffer* ibuf) {
        
        const char *msg = ibuf->get_from_buf();
        string msg_str(msg, msg+ibuf->length());
        ibuf->pop(ibuf->length());
        ibuf->adjust();
    
        PR_INFO("socket fd %d recv message:%s", conn->get_fd(), msg_str.c_str());

        conn->send(msg_str.c_str(), msg_str.length());
    }